

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Promise<void> __thiscall
capnp::anon_unknown_69::WindowFlowController::waitAllAcked(WindowFlowController *this)

{
  undefined8 *puVar1;
  long *plVar2;
  SourceLocation location;
  long in_RSI;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  undefined8 unaff_retaddr;
  PromiseFulfillerPair<kj::Promise<void>_> paf;
  _func_int **local_48;
  undefined4 local_40;
  undefined4 uStackY_3c;
  undefined4 uStackY_38;
  undefined4 uStackY_34;
  
  if ((*(int *)(in_RSI + 0x28) == 1) && (*(long *)(in_RSI + 0x38) != *(long *)(in_RSI + 0x30))) {
    location.function = (char *)unaff_R15;
    location.fileName = (char *)unaff_R14;
    location._16_8_ = unaff_retaddr;
    kj::newPromiseAndFulfiller<kj::Promise<void>>(location);
    puVar1 = *(undefined8 **)(in_RSI + 0x1c0);
    plVar2 = *(long **)(in_RSI + 0x1c8);
    *(undefined4 *)(in_RSI + 0x1c0) = local_40;
    *(undefined4 *)(in_RSI + 0x1c4) = uStackY_3c;
    *(undefined4 *)(in_RSI + 0x1c8) = uStackY_38;
    *(undefined4 *)(in_RSI + 0x1cc) = uStackY_34;
    if (plVar2 != (long *)0x0) {
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    (this->super_RpcFlowController)._vptr_RpcFlowController = local_48;
  }
  else {
    kj::TaskSet::onEmpty((TaskSet *)this);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> waitAllAcked() override {
    KJ_IF_SOME(q, state.tryGet<Running>()) {
      if (!q.empty()) {
        auto paf = kj::newPromiseAndFulfiller<kj::Promise<void>>();
        emptyFulfiller = kj::mv(paf.fulfiller);
        return kj::mv(paf.promise);
      }
    }
    return tasks.onEmpty();
  }